

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_node(FILE *file,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,REF_NODE ref_node,
             REF_LONG nnode)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  long local_218;
  int local_1c0;
  int local_170;
  long local_138;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  char *yp_5;
  char *xp_5;
  double y_5;
  char *yp_4;
  char *xp_4;
  double y_4;
  char *yp_3;
  char *xp_3;
  double y_3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  char *yp_2;
  char *xp_2;
  double y_2;
  char *yp_1;
  char *xp_1;
  double y_1;
  char *yp;
  char *xp;
  double y;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL *xyz;
  REF_DBL dbl;
  REF_LONG id;
  REF_INT n;
  REF_INT part;
  REF_INT new_node;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_LONG nnode_local;
  REF_NODE ref_node_local;
  REF_INT local_20;
  REF_BOOL twod_local;
  REF_INT version_local;
  REF_BOOL swap_endian_local;
  FILE *file_local;
  
  _new_node = ref_node->ref_mpi;
  ref_mpi = (REF_MPI)nnode;
  nnode_local = (REF_LONG)ref_node;
  ref_node_local._4_4_ = twod;
  local_20 = version;
  twod_local = swap_endian;
  _version_local = (FILE *)file;
  file_local._4_4_ = ref_node_initialize_n_global(ref_node,nnode);
  if (file_local._4_4_ == 0) {
    if (_new_node->id == 0) {
      id._4_4_ = 0;
      part = 0;
LAB_0016e5a7:
      if ((long)ref_mpi -
          (long)_new_node->n *
          ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n) < 2) {
        local_138 = (1 - ((long)ref_mpi -
                         (long)_new_node->n *
                         ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n))) *
                    ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n) +
                    ((long)ref_mpi -
                    (long)_new_node->n *
                    ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)) *
                    (((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
      }
      else {
        local_138 = ((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n;
      }
      if (local_138 <= part) {
        for (id._4_4_ = 1; id._4_4_ < _new_node->n; id._4_4_ = id._4_4_ + 1) {
          iVar1 = (int)ref_mpi;
          if ((long)(id._4_4_ + 1) <
              (long)ref_mpi -
              (long)_new_node->n *
              ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)) {
            local_170 = (id._4_4_ + 1) *
                        (int)(((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
          }
          else {
            local_170 = ((id._4_4_ + 1) -
                        (iVar1 - _new_node->n *
                                 (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) /
                                      (long)_new_node->n))) *
                        (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)
                        + (iVar1 - _new_node->n *
                                   (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) /
                                        (long)_new_node->n)) *
                          (int)(((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
          }
          if ((long)id._4_4_ <
              (long)ref_mpi -
              (long)_new_node->n *
              ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)) {
            local_1c0 = id._4_4_ *
                        (int)(((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
          }
          else {
            local_1c0 = (id._4_4_ -
                        (iVar1 - _new_node->n *
                                 (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) /
                                      (long)_new_node->n))) *
                        (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)
                        + (iVar1 - _new_node->n *
                                   (int)((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) /
                                        (long)_new_node->n)) *
                          (int)(((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
          }
          id._0_4_ = local_170 - local_1c0;
          uVar2 = ref_mpi_scatter_send(_new_node,&id,1,1,id._4_4_);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x66,"ref_part_node",(ulong)uVar2,"send");
            return uVar2;
          }
          if (0 < (int)id) {
            if ((int)id * 3 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x68,"ref_part_node","malloc xyz of REF_DBL negative");
              return 1;
            }
            pvVar4 = malloc((long)((int)id * 3) << 3);
            if (pvVar4 == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x68,"ref_part_node","malloc xyz of REF_DBL NULL");
              return 2;
            }
            for (part = 0; part < (int)id; part = part + 1) {
              sVar3 = fread(&xyz,8,1,_version_local);
              if (sVar3 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x6a,"ref_part_node","x");
                return 1;
              }
              if (twod_local != 0) {
                xp_3._7_1_ = xyz._0_1_;
                xp_3._6_1_ = xyz._1_1_;
                xp_3._5_1_ = xyz._2_1_;
                xp_3._4_1_ = xyz._3_1_;
                xp_3._3_1_ = xyz._4_1_;
                xp_3._2_1_ = xyz._5_1_;
                xp_3._1_1_ = xyz._6_1_;
                xp_3._0_1_ = xyz._7_1_;
                xyz = (REF_DBL *)xp_3;
              }
              *(REF_DBL **)((long)pvVar4 + (long)(part * 3) * 8) = xyz;
              sVar3 = fread(&xyz,8,1,_version_local);
              if (sVar3 != 1) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x6d,"ref_part_node","y");
                return 1;
              }
              if (twod_local != 0) {
                xp_4._7_1_ = xyz._0_1_;
                xp_4._6_1_ = xyz._1_1_;
                xp_4._5_1_ = xyz._2_1_;
                xp_4._4_1_ = xyz._3_1_;
                xp_4._3_1_ = xyz._4_1_;
                xp_4._2_1_ = xyz._5_1_;
                xp_4._1_1_ = xyz._6_1_;
                xp_4._0_1_ = xyz._7_1_;
                xyz = (REF_DBL *)xp_4;
              }
              *(REF_DBL **)((long)pvVar4 + (long)(part * 3 + 1) * 8) = xyz;
              if (ref_node_local._4_4_ == 0) {
                sVar3 = fread(&xyz,8,1,_version_local);
                if (sVar3 != 1) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x71,"ref_part_node","z");
                  return 1;
                }
                if (twod_local != 0) {
                  xp_5._7_1_ = xyz._0_1_;
                  xp_5._6_1_ = xyz._1_1_;
                  xp_5._5_1_ = xyz._2_1_;
                  xp_5._4_1_ = xyz._3_1_;
                  xp_5._3_1_ = xyz._4_1_;
                  xp_5._2_1_ = xyz._5_1_;
                  xp_5._1_1_ = xyz._6_1_;
                  xp_5._0_1_ = xyz._7_1_;
                  xyz = (REF_DBL *)xp_5;
                }
              }
              else {
                xyz = (REF_DBL *)0x0;
              }
              *(REF_DBL **)((long)pvVar4 + (long)(part * 3 + 2) * 8) = xyz;
              if ((0 < local_20) &&
                 (uVar2 = ref_part_meshb_long((FILE *)_version_local,local_20,(REF_LONG *)&dbl),
                 uVar2 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x78,"ref_part_node",(ulong)uVar2,"nnode");
                return uVar2;
              }
            }
            uVar2 = ref_mpi_scatter_send(_new_node,pvVar4,(int)id * 3,3,id._4_4_);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x7b,"ref_part_node",(ulong)uVar2,"send");
              return uVar2;
            }
            free(pvVar4);
          }
        }
        goto LAB_0016f8c3;
      }
      uVar2 = ref_node_add((REF_NODE)nnode_local,(long)part,&n);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x52
               ,"ref_part_node",(ulong)uVar2,"new_node");
        return uVar2;
      }
      *(REF_INT *)(*(long *)(nnode_local + 0x28) + (long)n * 4) = _new_node->id;
      sVar3 = fread(&xyz,8,1,_version_local);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x54
               ,"ref_part_node","x");
        return 1;
      }
      if (twod_local != 0) {
        xp._7_1_ = xyz._0_1_;
        xp._6_1_ = xyz._1_1_;
        xp._5_1_ = xyz._2_1_;
        xp._4_1_ = xyz._3_1_;
        xp._3_1_ = xyz._4_1_;
        xp._2_1_ = xyz._5_1_;
        xp._1_1_ = xyz._6_1_;
        xp._0_1_ = xyz._7_1_;
        xyz = (REF_DBL *)xp;
      }
      *(REF_DBL **)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf) * 8) = xyz;
      sVar3 = fread(&xyz,8,1,_version_local);
      if (sVar3 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x57
               ,"ref_part_node","y");
        return 1;
      }
      if (twod_local != 0) {
        xp_1._7_1_ = xyz._0_1_;
        xp_1._6_1_ = xyz._1_1_;
        xp_1._5_1_ = xyz._2_1_;
        xp_1._4_1_ = xyz._3_1_;
        xp_1._3_1_ = xyz._4_1_;
        xp_1._2_1_ = xyz._5_1_;
        xp_1._1_1_ = xyz._6_1_;
        xp_1._0_1_ = xyz._7_1_;
        xyz = (REF_DBL *)xp_1;
      }
      *(REF_DBL **)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf + 1) * 8) = xyz;
      if (ref_node_local._4_4_ == 0) {
        sVar3 = fread(&xyz,8,1,_version_local);
        if (sVar3 != 1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x5b,"ref_part_node","z");
          return 1;
        }
        if (twod_local != 0) {
          xp_2._7_1_ = xyz._0_1_;
          xp_2._6_1_ = xyz._1_1_;
          xp_2._5_1_ = xyz._2_1_;
          xp_2._4_1_ = xyz._3_1_;
          xp_2._3_1_ = xyz._4_1_;
          xp_2._2_1_ = xyz._5_1_;
          xp_2._1_1_ = xyz._6_1_;
          xp_2._0_1_ = xyz._7_1_;
          xyz = (REF_DBL *)xp_2;
        }
      }
      else {
        xyz = (REF_DBL *)0x0;
      }
      *(REF_DBL **)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf + 2) * 8) = xyz;
      if ((local_20 < 1) ||
         (file_local._4_4_ = ref_part_meshb_long((FILE *)_version_local,local_20,(REF_LONG *)&dbl),
         file_local._4_4_ == 0)) goto LAB_0016eb7f;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x61,
             "ref_part_node",(ulong)file_local._4_4_,"nnode");
    }
    else {
      file_local._4_4_ = ref_mpi_scatter_recv(_new_node,&id,1,1);
      if (file_local._4_4_ == 0) {
        if (0 < (int)id) {
          if ((int)id * 3 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x82,"ref_part_node","malloc xyz of REF_DBL negative");
            return 1;
          }
          pvVar4 = malloc((long)((int)id * 3) << 3);
          if (pvVar4 == (void *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x82,"ref_part_node","malloc xyz of REF_DBL NULL");
            return 2;
          }
          uVar2 = ref_mpi_scatter_recv(_new_node,pvVar4,(int)id * 3,3);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x83,"ref_part_node",(ulong)uVar2,"recv");
            return uVar2;
          }
          for (part = 0; part < (int)id; part = part + 1) {
            if ((long)_new_node->id <
                (long)ref_mpi -
                (long)_new_node->n *
                ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)) {
              local_218 = (long)_new_node->id *
                          (((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
            }
            else {
              local_218 = ((long)_new_node->id -
                          ((long)ref_mpi -
                          (long)_new_node->n *
                          ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)))
                          * ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n)
                          + ((long)ref_mpi -
                            (long)_new_node->n *
                            ((long)((long)&ref_mpi[-1].reduce_byte_limit + 3) / (long)_new_node->n))
                            * (((long)ref_mpi + (long)_new_node->n + -1) / (long)_new_node->n);
            }
            uVar2 = ref_node_add((REF_NODE)nnode_local,part + local_218,&n);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x89,"ref_part_node",(ulong)uVar2,"new_node");
              return uVar2;
            }
            *(REF_INT *)(*(long *)(nnode_local + 0x28) + (long)n * 4) = _new_node->id;
            *(undefined8 *)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf) * 8) =
                 *(undefined8 *)((long)pvVar4 + (long)(part * 3) * 8);
            *(undefined8 *)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf + 1) * 8) =
                 *(undefined8 *)((long)pvVar4 + (long)(part * 3 + 1) * 8);
            *(undefined8 *)(*(long *)(nnode_local + 0x38) + (long)(n * 0xf + 2) * 8) =
                 *(undefined8 *)((long)pvVar4 + (long)(part * 3 + 2) * 8);
          }
          free(pvVar4);
        }
LAB_0016f8c3:
        file_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x80
               ,"ref_part_node",(ulong)file_local._4_4_,"recv");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x4c,
           "ref_part_node",(ulong)file_local._4_4_,"init nnodesg");
  }
  return file_local._4_4_;
LAB_0016eb7f:
  part = part + 1;
  goto LAB_0016e5a7;
}

Assistant:

REF_FCN static REF_STATUS ref_part_node(FILE *file, REF_BOOL swap_endian,
                                        REF_INT version, REF_BOOL twod,
                                        REF_NODE ref_node, REF_LONG nnode) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT node, new_node;
  REF_INT part;
  REF_INT n;
  REF_LONG id;
  REF_DBL dbl;
  REF_DBL *xyz;

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init nnodesg");

  if (ref_mpi_once(ref_mpi)) {
    part = 0;
    for (node = 0; node < ref_part_first(nnode, ref_mpi_n(ref_mpi), 1);
         node++) {
      RSS(ref_node_add(ref_node, node, &new_node), "new_node");
      ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 0, new_node) = dbl;
      RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
      if (swap_endian) SWAP_DBL(dbl);
      ref_node_xyz(ref_node, 1, new_node) = dbl;
      if (!twod) {
        RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
        if (swap_endian) SWAP_DBL(dbl);
      } else {
        dbl = 0.0;
      }
      ref_node_xyz(ref_node, 2, new_node) = dbl;
      if (version > 0) RSS(ref_part_meshb_long(file, version, &id), "nnode");
    }
    each_ref_mpi_worker(ref_mpi, part) {
      n = (REF_INT)(ref_part_first(nnode, ref_mpi_n(ref_mpi), part + 1) -
                    ref_part_first(nnode, ref_mpi_n(ref_mpi), part));
      RSS(ref_mpi_scatter_send(ref_mpi, &n, 1, REF_INT_TYPE, part), "send");
      if (n > 0) {
        ref_malloc(xyz, 3 * n, REF_DBL);
        for (node = 0; node < n; node++) {
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "x");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[0 + 3 * node] = dbl;
          RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "y");
          if (swap_endian) SWAP_DBL(dbl);
          xyz[1 + 3 * node] = dbl;
          if (!twod) {
            RES(1, fread(&dbl, sizeof(REF_DBL), 1, file), "z");
            if (swap_endian) SWAP_DBL(dbl);
          } else {
            dbl = 0.0;
          }
          xyz[2 + 3 * node] = dbl;
          if (version > 0)
            RSS(ref_part_meshb_long(file, version, &id), "nnode");
        }
        RSS(ref_mpi_scatter_send(ref_mpi, xyz, 3 * n, REF_DBL_TYPE, part),
            "send");
        free(xyz);
      }
    }
  } else {
    RSS(ref_mpi_scatter_recv(ref_mpi, &n, 1, REF_INT_TYPE), "recv");
    if (n > 0) {
      ref_malloc(xyz, 3 * n, REF_DBL);
      RSS(ref_mpi_scatter_recv(ref_mpi, xyz, 3 * n, REF_DBL_TYPE), "recv");
      for (node = 0; node < n; node++) {
        RSS(ref_node_add(ref_node,
                         node + ref_part_first(nnode, ref_mpi_n(ref_mpi),
                                               ref_mpi_rank(ref_mpi)),
                         &new_node),
            "new_node");
        ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
        ref_node_xyz(ref_node, 0, new_node) = xyz[0 + 3 * node];
        ref_node_xyz(ref_node, 1, new_node) = xyz[1 + 3 * node];
        ref_node_xyz(ref_node, 2, new_node) = xyz[2 + 3 * node];
      }
      free(xyz);
    }
  }

  return REF_SUCCESS;
}